

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *in_R9;
  Amount AVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  bool *in_stack_fffffffffffffd38;
  AssertionResult *in_stack_fffffffffffffd40;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd48;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string local_248;
  AssertHelper local_228;
  Message local_220;
  byte local_211;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined8 local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  int64_t local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  int64_t local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  size_type local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140 [2];
  char local_130 [72];
  CoinSelectionOption *in_stack_ffffffffffffff18;
  UtxoFilter *in_stack_ffffffffffffff20;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffff28;
  Amount *in_stack_ffffffffffffff30;
  CoinSelection *in_stack_ffffffffffffff38;
  Amount *in_stack_ffffffffffffff50;
  Amount *in_stack_ffffffffffffff58;
  Amount *in_stack_ffffffffffffff60;
  bool *in_stack_ffffffffffffff68;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_88;
  undefined1 local_69 [17];
  int64_t local_58;
  undefined1 local_50;
  undefined1 local_48 [32];
  int64_t local_28;
  undefined1 local_20;
  int64_t local_18;
  undefined1 local_10;
  
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x1befcb60);
  local_28 = AVar4.amount_;
  local_20 = AVar4.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount((Amount *)(local_48 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_48);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_69._1_8_ = AVar4.amount_;
  local_69[9] = AVar4.ignore_check_;
  local_69[0] = 0;
  local_58 = local_69._1_8_;
  local_50 = local_69[9];
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x26be5c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      GetBitcoinOption();
      in_stack_fffffffffffffd50 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_69;
      in_stack_fffffffffffffd48 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_48;
      in_stack_fffffffffffffd40 = (AssertionResult *)(local_48 + 0x10);
      in_stack_fffffffffffffd38 = (bool *)&local_58;
      in_R9 = local_130;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd50);
      cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x26bf40);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd50);
    }
  }
  else {
    testing::Message::Message(local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x113,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x26c056);
  }
  local_160 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_88);
  local_164 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
             (unsigned_long *)in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x26c145);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x26c1a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26c1fa);
  local_190 = cfd::core::Amount::GetSatoshiValue((Amount *)(local_48 + 0x10));
  local_194 = 1250000000;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
             (long *)in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x26c2bc);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x26c319);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26c371);
  local_1c0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_48);
  local_1c4 = 0x708;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
             (long *)in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x26c433);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x26c490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26c4e8);
  sVar3 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_88);
  if (sVar3 == 1) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_88,0);
    local_1f0 = 1250000000;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
               (unsigned_long *)in_stack_fffffffffffffd48,(long *)in_stack_fffffffffffffd40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x26c5b1);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x119,pcVar2);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x26c60e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26c663);
  }
  local_211 = ~local_69[0] & 1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(type *)0x26c6a2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)&local_210,(AssertionResult *)"use_bnb","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    testing::Message::~Message((Message *)0x26c788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26c800);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd50);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower)
{
  // Amount target_amount = Amount::CreateBySatoshiAmount(460000000);
  Amount target_amount = Amount::CreateBySatoshiAmount(468700000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), 1250000000);
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(1250000000));
  }
  EXPECT_FALSE(use_bnb);
}